

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall Compiler::visit(Compiler *this,FloatLit *node)

{
  iterator __position;
  long lVar1;
  value_type_conflict val;
  array<unsigned_char,_8UL> tmp;
  uchar local_2a [2];
  double local_28;
  
  local_28 = node->m_value;
  local_2a[1] = 10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->m_buffer,local_2a + 1);
  lVar1 = 0;
  do {
    local_2a[0] = *(uchar *)((long)&local_28 + lVar1);
    __position._M_current = *(uchar **)&this->field_0x10;
    if (__position._M_current == *(uchar **)&this->field_0x18) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,__position,
                 local_2a);
    }
    else {
      *__position._M_current = local_2a[0];
      *(long *)&this->field_0x10 = *(long *)&this->field_0x10 + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void Compiler::visit(AST::FloatLit *node) {
    std::array<Bytecode, sizeof(double)> tmp = {};
    memcpy(tmp.data(), &node->m_value, sizeof(double));
    m_buffer.push_back(Opcode::DCONST);
    for (auto val : tmp) {
        m_buffer.push_back(val);
    }
}